

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

void http_CalcResponseVersion
               (int request_major_vers,int request_minor_vers,int *response_major_vers,
               int *response_minor_vers)

{
  int *response_minor_vers_local;
  int *response_major_vers_local;
  int request_minor_vers_local;
  int request_major_vers_local;
  
  if ((request_major_vers < 2) && ((request_major_vers != 1 || (request_minor_vers < 1)))) {
    *response_major_vers = request_major_vers;
    *response_minor_vers = request_minor_vers;
  }
  else {
    *response_major_vers = 1;
    *response_minor_vers = 1;
  }
  return;
}

Assistant:

void http_CalcResponseVersion(int request_major_vers,
	int request_minor_vers,
	int *response_major_vers,
	int *response_minor_vers)
{
	if ((request_major_vers > 1) ||
		(request_major_vers == 1 && request_minor_vers >= 1)) {
		*response_major_vers = 1;
		*response_minor_vers = 1;
	} else {
		*response_major_vers = request_major_vers;
		*response_minor_vers = request_minor_vers;
	}
}